

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.hpp
# Opt level: O1

String __thiscall
Arguments::RefAction<Bstrlib::String>::match
          (RefAction<Bstrlib::String> *this,Descriptor *desc,String *values,int valuesCount)

{
  undefined4 in_register_0000000c;
  uchar *extraout_RDX;
  uchar *puVar1;
  int in_R8D;
  String SVar2;
  String SVar3;
  String SStack_28;
  
  if (((CONCAT44(in_register_0000000c,valuesCount) == 0) || (in_R8D != 1)) ||
     (values[3].super_tagbstring.mlen != 1)) {
    SVar2 = Bstrlib::operator+((char *)this,(String *)"Invalid number of arguments for option: ");
    puVar1 = SVar2.super_tagbstring.data;
  }
  else {
    Bstrlib::String::String(&SStack_28,(String *)CONCAT44(in_register_0000000c,valuesCount));
    Bstrlib::String::operator=(*(String **)&(desc->shortTrigger).super_tagbstring,&SStack_28);
    Bstrlib::String::~String(&SStack_28);
    Bstrlib::String::String((String *)this,"");
    puVar1 = extraout_RDX;
  }
  SVar3.super_tagbstring.data = puVar1;
  SVar3.super_tagbstring._0_8_ = this;
  return (String)SVar3.super_tagbstring;
}

Assistant:

virtual String match(const Descriptor & desc, const String * values, const int valuesCount)
        {
            if (valuesCount != desc.requiredValues || valuesCount != 1 || !values) return TRANS("Invalid number of arguments for option: ") + TRANS(desc.longTrigger);
            // If the compiler stops here, it's because there is no known way to convert from a String to your type T. You'll have to provide your own specialization of this template for this
            ref = (T)values[0];
            return "";
        }